

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

char * lj_lex_token2str(LexState *ls,LexToken tok)

{
  uint in_ESI;
  long in_RDI;
  char *local_8;
  
  if ((int)in_ESI < 0x101) {
    if ((""[(long)(int)in_ESI + 1] & 1) == 0) {
      local_8 = lj_strfmt_pushf(*(lua_State **)(in_RDI + 8),"%c",(ulong)in_ESI);
    }
    else {
      local_8 = lj_strfmt_pushf(*(lua_State **)(in_RDI + 8),"char(%d)",(ulong)in_ESI);
    }
  }
  else {
    local_8 = tokennames[(int)(in_ESI - 0x101)];
  }
  return local_8;
}

Assistant:

const char *lj_lex_token2str(LexState *ls, LexToken tok)
{
  if (tok > TK_OFS)
    return tokennames[tok-TK_OFS-1];
  else if (!lj_char_iscntrl(tok))
    return lj_strfmt_pushf(ls->L, "%c", tok);
  else
    return lj_strfmt_pushf(ls->L, "char(%d)", tok);
}